

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O1

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,__1,_0,__1,__1> *a_lhs,
               Matrix<double,__1,__1,_0,__1,__1> *a_rhs,Scalar *alpha)

{
  Scalar SVar1;
  long lVar2;
  long lVar3;
  BlockingType blocking;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> local_88;
  gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
  local_48;
  
  local_88.super_level3_blocking<double,_double>.m_mc =
       (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar2 = (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
  ;
  if (local_88.super_level3_blocking<double,_double>.m_mc == lVar2) {
    local_88.super_level3_blocking<double,_double>.m_nc =
         (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    lVar3 = (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols;
    if (local_88.super_level3_blocking<double,_double>.m_nc == lVar3) {
      if (((lVar3 != 0) && (lVar2 != 0)) &&
         (local_88.super_level3_blocking<double,_double>.m_kc =
               (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols, local_88.super_level3_blocking<double,_double>.m_kc != 0)) {
        SVar1 = *alpha;
        local_88.super_level3_blocking<double,_double>.m_blockA = (LhsScalar *)0x0;
        local_88.super_level3_blocking<double,_double>.m_blockB = (RhsScalar *)0x0;
        evaluateProductBlockingSizesHeuristic<double,double,1,long>
                  (&local_88.super_level3_blocking<double,_double>.m_kc,
                   &local_88.super_level3_blocking<double,_double>.m_mc,
                   &local_88.super_level3_blocking<double,_double>.m_nc,1);
        local_88.m_sizeA =
             local_88.super_level3_blocking<double,_double>.m_mc *
             local_88.super_level3_blocking<double,_double>.m_kc;
        local_88.m_sizeB =
             local_88.super_level3_blocking<double,_double>.m_kc *
             local_88.super_level3_blocking<double,_double>.m_nc;
        local_48.m_blocking = &local_88;
        local_48.m_lhs = a_lhs;
        local_48.m_rhs = a_rhs;
        local_48.m_dest = dst;
        local_48.m_actualAlpha = SVar1;
        gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
        ::operator()(&local_48,0,
                     (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_rows,0,
                     (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols,(GemmParallelInfo<long> *)0x0);
        free(local_88.super_level3_blocking<double,_double>.m_blockA);
        free(local_88.super_level3_blocking<double,_double>.m_blockB);
      }
      return;
    }
  }
  __assert_fail("dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,0x1cc,
                "static void Eigen::internal::generic_product_impl<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, Eigen::DenseShape, Eigen::DenseShape, 8>::scaleAndAddTo(Dest &, const Lhs &, const Rhs &, const Scalar &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, LhsShape = Eigen::DenseShape, RhsShape = Eigen::DenseShape, ProductType = 8, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

static void scaleAndAddTo(Dest& dst, const Lhs& a_lhs, const Rhs& a_rhs, const Scalar& alpha)
  {
    eigen_assert(dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols());
    if(a_lhs.cols()==0 || a_lhs.rows()==0 || a_rhs.cols()==0)
      return;

    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    Scalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(a_lhs)
                               * RhsBlasTraits::extractScalarFactor(a_rhs);

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,LhsScalar,RhsScalar,
            Dest::MaxRowsAtCompileTime,Dest::MaxColsAtCompileTime,MaxDepthAtCompileTime> BlockingType;

    typedef internal::gemm_functor<
      Scalar, Index,
      internal::general_matrix_matrix_product<
        Index,
        LhsScalar, (ActualLhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(LhsBlasTraits::NeedToConjugate),
        RhsScalar, (ActualRhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(RhsBlasTraits::NeedToConjugate),
        (Dest::Flags&RowMajorBit) ? RowMajor : ColMajor>,
      ActualLhsTypeCleaned, ActualRhsTypeCleaned, Dest, BlockingType> GemmFunctor;

    BlockingType blocking(dst.rows(), dst.cols(), lhs.cols(), 1, true);
    internal::parallelize_gemm<(Dest::MaxRowsAtCompileTime>32 || Dest::MaxRowsAtCompileTime==Dynamic)>
        (GemmFunctor(lhs, rhs, dst, actualAlpha, blocking), a_lhs.rows(), a_rhs.cols(), a_lhs.cols(), Dest::Flags&RowMajorBit);
  }